

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

Test * SubprocessTestInterruptParentWithSigTerm::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x2d8);
  SubprocessTestInterruptParentWithSigTerm((SubprocessTestInterruptParentWithSigTerm *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(SubprocessTest, InterruptParentWithSigTerm) {
  Subprocess* subproc = subprocs_.Add("kill -TERM $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork(NULL);
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}